

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.c
# Opt level: O2

Map * Map_Check_And_Get(Map *tree,void *str,size_t size)

{
  size_t temp;
  Map *local_20;
  ulong local_18;
  
  local_20 = tree;
  Map_Scour(tree,str,size,&local_18,&local_20);
  if (local_18 < size) {
    local_20 = (Map *)0x0;
  }
  return local_20;
}

Assistant:

struct Map* Map_Check_And_Get(Map *tree, void *str,size_t size)
{
	size_t temp;
	Map_Scour(tree,str,size,&temp,&tree);

	if(temp<size)
	{
		return NULL;	
	}else
	{
		return tree;
	}
}